

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42parse.c
# Opt level: O0

void t42_parse_sfnts(T42_Face face,T42_Loader loader)

{
  char *pcVar1;
  bool bVar2;
  FT_ULong FVar3;
  FT_Pointer pvVar4;
  void *pvVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  void *in_RCX;
  long extraout_RDX;
  char *pcVar9;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  FT_Byte *P;
  FT_Pointer pvVar10;
  FT_Byte *p;
  FT_Long ttf_reserved_prev_1;
  FT_ULong len;
  int i;
  FT_Long ttf_reserved_prev;
  FT_Long tmp;
  FT_ULong size;
  T42_Load_Status status;
  FT_Bool allocated;
  FT_Byte *string_buf;
  FT_ULong real_size;
  FT_ULong old_string_size;
  FT_ULong string_size;
  FT_ULong n;
  FT_Long ttf_reserved;
  FT_Long ttf_count;
  FT_Int num_tables;
  FT_Error error;
  FT_Byte *limit;
  FT_Byte *cur;
  FT_Memory memory;
  T42_Parser parser;
  T42_Loader loader_local;
  T42_Face face_local;
  
  cur = (FT_Byte *)(loader->parser).root.memory;
  _num_tables = (loader->parser).root.limit;
  ttf_count._0_4_ = 0;
  _status = (FT_Pointer)0x0;
  bVar2 = false;
  P = face->ttf_data;
  memory = (FT_Memory)loader;
  parser = &loader->parser;
  loader_local = (T42_Loader)face;
  ft_mem_free((FT_Memory)cur,P);
  *(undefined8 *)&loader_local[1].encoding_table.max_elems = 0;
  loader_local[1].encoding_table.elements = (FT_Byte **)0x0;
  (*memory[1].realloc)(memory,(long)P,extraout_RDX,in_RCX);
  if (memory->user < _num_tables) {
    pcVar1 = (char *)memory->user;
    pcVar9 = pcVar1 + 1;
    memory->user = pcVar9;
    if (*pcVar1 == '[') {
      (*memory[1].realloc)(memory,(long)P,(long)pcVar9,memory);
      size._0_4_ = 0;
      old_string_size = 0;
      real_size = 0;
      ttf_reserved = 0;
      n = 0xc;
      pvVar10 = (FT_Pointer)0xc;
      pvVar4 = ft_mem_qalloc((FT_Memory)cur,0xc,(FT_Error *)((long)&ttf_count + 4));
      *(FT_Pointer *)&loader_local[1].encoding_table.max_elems = pvVar4;
      lVar7 = extraout_RDX_00;
      if (ttf_count._4_4_ == 0) {
        while (memory->user < _num_tables) {
          limit = (FT_Byte *)memory->user;
          if (*limit == 0x5d) {
            memory->user = (void *)((long)memory->user + 1);
            loader_local[1].encoding_table.elements = (FT_Byte **)ttf_reserved;
            goto LAB_00366069;
          }
          if (*limit == 0x3c) {
            if ((_status != (void *)0x0) && (!bVar2)) {
              ttf_count._4_4_ = 3;
              goto LAB_0036605f;
            }
            (*(code *)memory[2].user)(memory);
            if (*(int *)&memory->realloc != 0) goto LAB_00366069;
            old_string_size = ((long)memory->user + (-1 - (long)limit)) / 2;
            if (old_string_size == 0) {
              ttf_count._4_4_ = 3;
              goto LAB_0036605f;
            }
            _status = ft_mem_qrealloc((FT_Memory)cur,1,real_size,old_string_size,_status,
                                      (FT_Error *)((long)&ttf_count + 4));
            if (ttf_count._4_4_ != 0) goto LAB_0036605f;
            bVar2 = true;
            memory->user = limit;
            pvVar10 = _status;
            (*memory[2].realloc)(memory,(long)_status,old_string_size,&string_buf);
            real_size = old_string_size;
            old_string_size = (FT_ULong)string_buf;
            lVar7 = extraout_RDX_01;
          }
          else if (*limit - 0x30 < 10) {
            if (bVar2) {
              ttf_count._4_4_ = 3;
              goto LAB_0036605f;
            }
            pvVar5 = (*memory[2].alloc)(memory,(long)pvVar10);
            if ((long)pvVar5 < 0) {
              ttf_count._4_4_ = 3;
              goto LAB_0036605f;
            }
            old_string_size = (FT_ULong)pvVar5;
            (*(code *)memory[2].user)(memory);
            if (*(int *)&memory->realloc != 0) {
              return;
            }
            _status = (FT_Pointer)((long)memory->user + 1);
            if ((ulong)((long)_num_tables - (long)memory->user) <= old_string_size) {
              ttf_count._4_4_ = 3;
              goto LAB_0036605f;
            }
            memory->user = (void *)(old_string_size + 1 + (long)memory->user);
            lVar7 = extraout_RDX_02;
          }
          if (_status == (FT_Pointer)0x0) {
            ttf_count._4_4_ = 3;
            goto LAB_0036605f;
          }
          if (((old_string_size & 1) != 0) &&
             (*(char *)((long)_status + (old_string_size - 1)) == '\0')) {
            old_string_size = old_string_size - 1;
          }
          if (old_string_size == 0) {
            ttf_count._4_4_ = 3;
            goto LAB_0036605f;
          }
          pvVar5 = memory->user;
          uVar6 = (long)_num_tables - (long)pvVar5;
          for (string_size = 0; FVar3 = n, string_size < old_string_size;
              string_size = string_size + 1) {
            if ((int)size == 0) {
              if (0xb < ttf_reserved) {
                ttf_count._0_4_ =
                     (uint)*(byte *)(*(long *)&loader_local[1].encoding_table.max_elems + 4) * 0x10
                     + (uint)*(byte *)(*(long *)&loader_local[1].encoding_table.max_elems + 5);
                size._0_4_ = 1;
                n = (FT_ULong)((int)ttf_count * 0x10 + 0xc);
                if ((long)uVar6 < (long)n) {
                  ttf_count._4_4_ = 3;
                }
                else {
                  pvVar10 = ft_mem_qrealloc((FT_Memory)cur,1,FVar3,n,
                                            *(void **)&loader_local[1].encoding_table.max_elems,
                                            (FT_Error *)((long)&ttf_count + 4));
                  *(FT_Pointer *)&loader_local[1].encoding_table.max_elems = pvVar10;
                  lVar7 = extraout_RDX_03;
                  if (ttf_count._4_4_ == 0) goto LAB_00365e59;
                }
                goto LAB_0036605f;
              }
              lVar7 = CONCAT71((int7)((ulong)lVar7 >> 8),
                               *(undefined1 *)((long)_status + string_size));
              pvVar10 = (FT_Pointer)(ttf_reserved + 1);
              *(undefined1 *)(*(long *)&loader_local[1].encoding_table.max_elems + ttf_reserved) =
                   *(undefined1 *)((long)_status + string_size);
              pvVar5 = (void *)ttf_reserved;
              ttf_reserved = (FT_Long)pvVar10;
            }
            else {
              if ((int)size == 1) {
LAB_00365e59:
                FVar3 = n;
                if (ttf_reserved < (long)n) {
                  lVar7 = CONCAT71((int7)((ulong)lVar7 >> 8),
                                   *(undefined1 *)((long)_status + string_size));
                  pvVar10 = (FT_Pointer)(ttf_reserved + 1);
                  *(undefined1 *)(*(long *)&loader_local[1].encoding_table.max_elems + ttf_reserved)
                       = *(undefined1 *)((long)_status + string_size);
                  pvVar5 = (void *)ttf_reserved;
                  ttf_reserved = (FT_Long)pvVar10;
                  goto LAB_00366034;
                }
                for (len._4_4_ = 0; len._4_4_ < (int)ttf_count; len._4_4_ = len._4_4_ + 1) {
                  lVar7 = *(long *)&loader_local[1].encoding_table.max_elems +
                          (long)(len._4_4_ << 4);
                  uVar8 = (ulong)((uint)*(byte *)(lVar7 + 0x18) << 0x18 |
                                  (uint)*(byte *)(lVar7 + 0x19) << 0x10 |
                                  (uint)*(byte *)(lVar7 + 0x1a) << 8 | (uint)*(byte *)(lVar7 + 0x1b)
                                 );
                  if ((uVar6 < uVar8) || ((long)(uVar6 - uVar8) < (long)n)) {
                    ttf_count._4_4_ = 3;
                    goto LAB_0036605f;
                  }
                  n = (uVar8 + 3 & 0xfffffffc) + n;
                }
                n = n + 1;
                size._0_4_ = 2;
                pvVar10 = ft_mem_qrealloc((FT_Memory)cur,1,FVar3,n,
                                          *(void **)&loader_local[1].encoding_table.max_elems,
                                          (FT_Error *)((long)&ttf_count + 4));
                *(FT_Pointer *)&loader_local[1].encoding_table.max_elems = pvVar10;
                lVar7 = extraout_RDX_04;
                if (ttf_count._4_4_ != 0) goto LAB_0036605f;
              }
              else if ((int)size != 2) goto LAB_00366034;
              if ((long)n <= ttf_reserved) {
                ttf_count._4_4_ = 3;
                goto LAB_0036605f;
              }
              lVar7 = CONCAT71((int7)((ulong)lVar7 >> 8),
                               *(undefined1 *)((long)_status + string_size));
              pvVar10 = (FT_Pointer)(ttf_reserved + 1);
              *(undefined1 *)(*(long *)&loader_local[1].encoding_table.max_elems + ttf_reserved) =
                   *(undefined1 *)((long)_status + string_size);
              pvVar5 = (void *)ttf_reserved;
              ttf_reserved = (FT_Long)pvVar10;
            }
LAB_00366034:
          }
          (*memory[1].realloc)(memory,(long)pvVar10,lVar7,pvVar5);
          lVar7 = extraout_RDX_05;
        }
        ttf_count._4_4_ = 3;
      }
      goto LAB_0036605f;
    }
  }
  ttf_count._4_4_ = 3;
LAB_0036605f:
  *(int *)&memory->realloc = ttf_count._4_4_;
LAB_00366069:
  if (*(int *)&memory->realloc != 0) {
    ft_mem_free((FT_Memory)cur,*(void **)&loader_local[1].encoding_table.max_elems);
    *(undefined8 *)&loader_local[1].encoding_table.max_elems = 0;
    loader_local[1].encoding_table.elements = (FT_Byte **)0x0;
  }
  if (bVar2) {
    ft_mem_free((FT_Memory)cur,_status);
  }
  return;
}

Assistant:

static void
  t42_parse_sfnts( T42_Face    face,
                   T42_Loader  loader )
  {
    T42_Parser  parser = &loader->parser;
    FT_Memory   memory = parser->root.memory;
    FT_Byte*    cur;
    FT_Byte*    limit  = parser->root.limit;
    FT_Error    error;
    FT_Int      num_tables = 0;
    FT_Long     ttf_count;
    FT_Long     ttf_reserved;

    FT_ULong    n, string_size, old_string_size, real_size;
    FT_Byte*    string_buf = NULL;
    FT_Bool     allocated  = 0;

    T42_Load_Status  status;

    /** There should only be one sfnts array, but free any previous. */
    FT_FREE( face->ttf_data );
    face->ttf_size = 0;

    /* The format is                                */
    /*                                              */
    /*   /sfnts [ <hexstring> <hexstring> ... ] def */
    /*                                              */
    /* or                                           */
    /*                                              */
    /*   /sfnts [                                   */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      <num_bin_bytes> RD <binary data>        */
    /*      ...                                     */
    /*   ] def                                      */
    /*                                              */
    /* with exactly one space after the `RD' token. */

    T1_Skip_Spaces( parser );

    if ( parser->root.cursor >= limit || *parser->root.cursor++ != '[' )
    {
      FT_ERROR(( "t42_parse_sfnts: can't find begin of sfnts vector\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Fail;
    }

    T1_Skip_Spaces( parser );
    status          = BEFORE_START;
    string_size     = 0;
    old_string_size = 0;
    ttf_count       = 0;
    ttf_reserved    = 12;
    if ( FT_QALLOC( face->ttf_data, ttf_reserved ) )
      goto Fail;

    FT_TRACE2(( "\n" ));
    FT_TRACE2(( "t42_parse_sfnts:\n" ));

    while ( parser->root.cursor < limit )
    {
      FT_ULong  size;


      cur = parser->root.cursor;

      if ( *cur == ']' )
      {
        parser->root.cursor++;
        face->ttf_size = ttf_count;
        goto Exit;
      }

      else if ( *cur == '<' )
      {
        if ( string_buf && !allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        T1_Skip_PS_Token( parser );
        if ( parser->root.error )
          goto Exit;

        /* don't include delimiters */
        string_size = (FT_ULong)( ( parser->root.cursor - cur - 2 + 1 ) / 2 );
        if ( !string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        if ( FT_QREALLOC( string_buf, old_string_size, string_size ) )
          goto Fail;

        allocated = 1;

        parser->root.cursor = cur;
        (void)T1_ToBytes( parser, string_buf, string_size, &real_size, 1 );
        old_string_size = string_size;
        string_size     = real_size;
      }

      else if ( ft_isdigit( *cur ) )
      {
        FT_Long  tmp;


        if ( allocated )
        {
          FT_ERROR(( "t42_parse_sfnts: "
                     "can't handle mixed binary and hex strings\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        tmp = T1_ToInt( parser );
        if ( tmp < 0 )
        {
          FT_ERROR(( "t42_parse_sfnts: invalid string size\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          string_size = (FT_ULong)tmp;

        T1_Skip_PS_Token( parser );             /* `RD' */
        if ( parser->root.error )
          return;

        string_buf = parser->root.cursor + 1;   /* one space after `RD' */

        if ( (FT_ULong)( limit - parser->root.cursor ) <= string_size )
        {
          FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }
        else
          parser->root.cursor += string_size + 1;
      }

      if ( !string_buf )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      /* A string can have a trailing zero (odd) byte for padding. */
      /* Ignore it.                                                */
      if ( ( string_size & 1 ) && string_buf[string_size - 1] == 0 )
        string_size--;

      if ( !string_size )
      {
        FT_ERROR(( "t42_parse_sfnts: invalid string\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }

      FT_TRACE2(( "  PS string size %5lu bytes, offset 0x%08lx (%lu)\n",
                  string_size, ttf_count, ttf_count ));

      /* The whole TTF is now loaded into `string_buf'.  We are */
      /* checking its contents while copying it to `ttf_data'.  */

      size = (FT_ULong)( limit - parser->root.cursor );

      for ( n = 0; n < string_size; n++ )
      {
        switch ( status )
        {
        case BEFORE_START:
          /* load offset table, 12 bytes */
          if ( ttf_count < 12 )
          {
            face->ttf_data[ttf_count++] = string_buf[n];
            continue;
          }
          else
          {
            FT_Long ttf_reserved_prev = ttf_reserved;


            num_tables   = 16 * face->ttf_data[4] + face->ttf_data[5];
            status       = BEFORE_TABLE_DIR;
            ttf_reserved = 12 + 16 * num_tables;

            FT_TRACE2(( "  SFNT directory contains %d tables\n",
                        num_tables ));

            if ( (FT_Long)size < ttf_reserved )
            {
              FT_ERROR(( "t42_parse_sfnts: invalid data in sfnts array\n" ));
              error = FT_THROW( Invalid_File_Format );
              goto Fail;
            }

            if ( FT_QREALLOC( face->ttf_data, ttf_reserved_prev,
                              ttf_reserved ) )
              goto Fail;
          }
          FALL_THROUGH;

        case BEFORE_TABLE_DIR:
          /* the offset table is read; read the table directory */
          if ( ttf_count < ttf_reserved )
          {
            face->ttf_data[ttf_count++] = string_buf[n];
            continue;
          }
          else
          {
            int       i;
            FT_ULong  len;
            FT_Long ttf_reserved_prev = ttf_reserved;


            FT_TRACE2(( "\n" ));
            FT_TRACE2(( "  table    length\n" ));
            FT_TRACE2(( "  ------------------------------\n" ));

            for ( i = 0; i < num_tables; i++ )
            {
              FT_Byte*  p = face->ttf_data + 12 + 16 * i + 12;


              len = FT_PEEK_ULONG( p );
              FT_TRACE2(( "   %4i  0x%08lx (%lu)\n", i, len, len ));

              if ( len > size                               ||
                   ttf_reserved > (FT_Long)( size - len ) )
              {
                FT_ERROR(( "t42_parse_sfnts:"
                           " invalid data in sfnts array\n" ));
                error = FT_THROW( Invalid_File_Format );
                goto Fail;
              }

              /* Pad to a 4-byte boundary length */
              ttf_reserved += (FT_Long)( ( len + 3 ) & ~3U );
            }
            ttf_reserved += 1;

            status = OTHER_TABLES;

            FT_TRACE2(( "\n" ));
            FT_TRACE2(( "  allocating %ld bytes\n", ttf_reserved ));
            FT_TRACE2(( "\n" ));

            if ( FT_QREALLOC( face->ttf_data, ttf_reserved_prev,
                              ttf_reserved ) )
              goto Fail;
          }
          FALL_THROUGH;

        case OTHER_TABLES:
          /* all other tables are just copied */
          if ( ttf_count >= ttf_reserved )
          {
            FT_ERROR(( "t42_parse_sfnts: too much binary data\n" ));
            error = FT_THROW( Invalid_File_Format );
            goto Fail;
          }
          face->ttf_data[ttf_count++] = string_buf[n];
        }
      }

      T1_Skip_Spaces( parser );
    }

    /* if control reaches this point, the format was not valid */
    error = FT_THROW( Invalid_File_Format );

  Fail:
    parser->root.error = error;

  Exit:
    if ( parser->root.error )
    {
      FT_FREE( face->ttf_data );
      face->ttf_size = 0;
    }
    if ( allocated )
      FT_FREE( string_buf );
  }